

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

string * __thiscall JSON::unparse_abi_cxx11_(string *__return_storage_ptr__,JSON *this)

{
  element_type *peVar1;
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> _Var2;
  Pl_String p;
  Pl_String local_50;
  
  peVar1 = (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    Pl_String::Pl_String(&local_50,"unparse",(Pipeline *)0x0,__return_storage_ptr__);
    peVar1 = (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      Pipeline::operator<<(&local_50.super_Pipeline,"null");
    }
    else {
      _Var2._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
      super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
           (peVar1->value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                            .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl + 0x10))
                (_Var2._M_t.
                 super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
                 super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,&local_50,0);
    }
    Pl_String::~Pl_String(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
JSON::unparse() const
{
    if (!m) {
        return "null";
    }
    std::string s;
    Pl_String p("unparse", nullptr, s);
    write(&p, 0);
    return s;
}